

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

_Bool CrawlNumbers(Lexer *lexer)

{
  int iVar1;
  char cVar2;
  ushort **ppuVar3;
  ushort *puVar4;
  bool bVar5;
  char cVar6;
  _Bool _Var7;
  
  iVar1 = (lexer->tracker).currentTokenPosition;
  cVar6 = -1;
  if (iVar1 < lexer->length) {
    cVar6 = lexer->rawSourceCode[iVar1];
  }
  cVar2 = PeekNextCharacter(lexer);
  ppuVar3 = __ctype_b_loc();
  puVar4 = *ppuVar3;
  _Var7 = (_Bool)(cVar6 == '.' | (*(byte *)((long)puVar4 + (long)cVar6 * 2 + 1) & 8) >> 3);
  if (_Var7 == true) {
    (lexer->tracker).tokenStart = (lexer->tracker).currentTokenPosition;
    bVar5 = false;
    while ((cVar2 == '.' || ((puVar4[cVar2] & 0x800) != 0))) {
      cVar2 = PeekNextCharacter(lexer);
      GetNextCharacter(lexer);
      bVar5 = true;
      puVar4 = *ppuVar3;
    }
    if (!bVar5) {
      GetNextCharacter(lexer);
    }
    (lexer->tracker).tokenEnd = (lexer->tracker).currentTokenPosition;
  }
  return _Var7;
}

Assistant:

bool CrawlNumbers(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	bool isTrailingPeriod = currentChar == '.';
	if (isdigit(currentChar) || isTrailingPeriod){
		SetTokenStart(lexer);
		bool inside = false;
		while (true){
			if (!isdigit(nextChar) && nextChar != '.') break;
			nextChar = PeekNextCharacter(lexer);
			GetNextCharacter(lexer);
			inside = true;
		}
		if (!inside) GetNextCharacter(lexer);
		SetTokenEnd(lexer);
		return true;
	}
	return false;
}